

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,double sharpness)

{
  wchar_t *pwVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_wString format;
  ON_wString local_38;
  double local_30;
  double local_28;
  double local_20;
  
  if ((sharpness < 0.0) || (4.0 < sharpness)) {
    if ((sharpness != 5.0) || (NAN(sharpness))) {
      ON_wString::ON_wString((ON_wString *)this,L'⚠',1);
    }
    else {
      ON_wString::ON_wString((ON_wString *)this,L"crease");
    }
  }
  else {
    local_30 = 4.0;
    dVar4 = sharpness / 4.0;
    uVar2 = 0;
    dVar7 = 1.0;
    local_28 = dVar4 * -100.0;
    do {
      local_20 = dVar7 * 100.0 * dVar4;
      dVar5 = floor(local_20);
      uVar3 = -(ulong)(0.5 < local_20 - dVar5);
      dVar5 = (double)(~uVar3 & (ulong)dVar5 | (ulong)(dVar5 + 1.0) & uVar3) / dVar7;
      if (ABS(local_28 + dVar5) <= 5e-05) {
        dVar6 = 1.0 / dVar7;
        if (((sharpness <= 0.0) || (dVar6 <= dVar5)) &&
           ((dVar5 <= 100.0 - dVar6 || (dVar6 = 100.0 - dVar6, local_30 <= sharpness)))) {
          if (uVar2 != 0) {
LAB_005c8530:
            ON_wString::FormatToString((wchar_t *)&local_38,L"%%.%df%%%%",(ulong)uVar2);
            pwVar1 = ON_wString::operator_cast_to_wchar_t_(&local_38);
            ON_wString::FormatToString((wchar_t *)this,dVar5,pwVar1);
            ON_wString::~ON_wString(&local_38);
            return (ON_wString)(wchar_t *)this;
          }
          goto LAB_005c84d6;
        }
        dVar5 = dVar6;
        if (uVar2 == 4) goto LAB_005c8530;
      }
      uVar2 = uVar2 + 1;
      dVar7 = dVar7 * 10.0;
    } while (uVar2 != 5);
    dVar5 = dVar4 * 100.0;
LAB_005c84d6:
    ON_wString::FormatToString((wchar_t *)this,dVar5,L"%g%%");
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(double sharpness)
{
  if ( ON_SubDEdgeSharpness::IsValidValue(sharpness,false) )
  {
    const double s = sharpness / ON_SubDEdgeSharpness::MaximumValue;
    double m = 1.0; 
    unsigned max_decimal_places = 4;
    for (unsigned decimal_places = 0; decimal_places <= max_decimal_places; ++decimal_places, m *= 10.0 )
    {
      double p = 100.0 * m * s;
      double f = floor(p);
      if (p - f > 0.5)
        f = f + 1.0;
      f /= m;
      if (fabs(f - 100.0*s) <= 0.00005)
      {
        double minf = 1.0 / m;
        if (f < minf && sharpness > 0.0)
        {
          if (decimal_places < max_decimal_places)
            continue;          
          f = minf;
        }
        else if (f > 100.0 - minf && sharpness < ON_SubDEdgeSharpness::MaximumValue)
        {
          if (decimal_places < max_decimal_places)
            continue;
          f = 100.0 - minf;
        }
        if (0 == decimal_places)
          return ON_wString::FormatToString(L"%g%%", f);
        const ON_wString format = ON_wString::FormatToString(L"%%.%df%%%%", decimal_places);
        return ON_wString::FormatToString(format, f);
      }
    }
    return ON_wString::FormatToString(L"%g%%", s*100.0);
  }

  if (ON_SubDEdgeSharpness::CreaseValue == sharpness)
    return ON_wString(L"crease");

  return ON_wString(ON_wString::WarningSign);
}